

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyRenderbufferClearColor::initializeRbo
          (ModifyRenderbufferClearColor *this,GLES2ImageApi *api,GLuint renderbuffer,
          Texture2D *reference)

{
  Functions *gl_00;
  glViewportFunc p_Var1;
  glClearColorFunc p_Var2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deBool dVar6;
  PixelBufferAccess *access;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Functions *gl;
  Texture2D *reference_local;
  GLuint renderbuffer_local;
  GLES2ImageApi *api_local;
  ModifyRenderbufferClearColor *this_local;
  
  gl_00 = api->m_gl;
  framebufferRenderbuffer(gl_00,0x8ce0,renderbuffer);
  do {
    p_Var1 = gl_00->viewport;
    iVar3 = tcu::Texture2D::getWidth(reference);
    iVar4 = tcu::Texture2D::getHeight(reference);
    (*p_Var1)(0,0,iVar3,iVar4);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x339);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    p_Var2 = gl_00->clearColor;
    fVar7 = tcu::Vector<float,_4>::x(&this->m_color);
    fVar8 = tcu::Vector<float,_4>::y(&this->m_color);
    fVar9 = tcu::Vector<float,_4>::z(&this->m_color);
    fVar10 = tcu::Vector<float,_4>::w(&this->m_color);
    (*p_Var2)(fVar7,fVar8,fVar9,fVar10);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"clearColor(m_color.x(), m_color.y(), m_color.z(), m_color.w())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x33a);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    (*gl_00->clear)(0x4000);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x33b);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  access = tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
  tcu::clear(access,&this->m_color);
  return;
}

Assistant:

void GLES2ImageApi::ModifyRenderbufferClearColor::initializeRbo (GLES2ImageApi& api, GLuint renderbuffer, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;

	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));
	GLU_CHECK_GLW_CALL(gl, clearColor(m_color.x(), m_color.y(), m_color.z(), m_color.w()));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

	tcu::clear(reference.getLevel(0), m_color);
}